

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_Session * UA_SessionManager_getSession(UA_SessionManager *sm,UA_NodeId *token)

{
  UA_SecureChannel *pUVar1;
  UA_Boolean UVar2;
  UA_DateTime UVar3;
  ulong uVar4;
  session_list_entry *psVar5;
  UA_Session *pUVar6;
  ulong uVar7;
  
  psVar5 = (session_list_entry *)sm;
  do {
    psVar5 = ((session_list *)&psVar5->pointers)->lh_first;
    if (psVar5 == (session_list_entry *)0x0) {
      UA_LOG_INFO((sm->server->config).logger,UA_LOGCATEGORY_SESSION,
                  "Try to use Session with token %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x but is not found"
                  ,(ulong)(token->identifier).numeric,(ulong)(token->identifier).guid.data2,
                  (ulong)(token->identifier).guid.data3,(ulong)(token->identifier).guid.data4[0],
                  (ulong)(token->identifier).guid.data4[1],(ulong)(token->identifier).guid.data4[2],
                  (ulong)(token->identifier).guid.data4[3],(ulong)(token->identifier).guid.data4[4],
                  (ulong)(token->identifier).guid.data4[5],(ulong)(token->identifier).guid.data4[6],
                  (ulong)(token->identifier).guid.data4[7]);
      return (UA_Session *)0x0;
    }
    UVar2 = UA_NodeId_equal(&(psVar5->session).authenticationToken,token);
  } while (!UVar2);
  UVar3 = UA_DateTime_nowMonotonic();
  if ((psVar5->session).validTill < UVar3) {
    pUVar1 = (psVar5->session).channel;
    if (pUVar1 == (UA_SecureChannel *)0x0) {
      uVar4 = 0;
      uVar7 = 0;
    }
    else {
      if (pUVar1->connection == (UA_Connection *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)(uint)pUVar1->connection->sockfd;
      }
      uVar7 = (ulong)(pUVar1->securityToken).channelId;
    }
    pUVar6 = (UA_Session *)0x0;
    UA_LOG_INFO((sm->server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Client tries to use a session that has timed out"
                ,uVar4,uVar7,(ulong)(psVar5->session).sessionId.identifier.guid.data1,
                (ulong)(psVar5->session).sessionId.identifier.guid.data2,
                (ulong)(psVar5->session).sessionId.identifier.guid.data3,
                (ulong)(psVar5->session).sessionId.identifier.guid.data4[0],
                (ulong)(psVar5->session).sessionId.identifier.guid.data4[1],
                (ulong)(psVar5->session).sessionId.identifier.guid.data4[2],
                (ulong)(psVar5->session).sessionId.identifier.guid.data4[3],
                (ulong)(psVar5->session).sessionId.identifier.guid.data4[4],
                (ulong)(psVar5->session).sessionId.identifier.guid.data4[5],
                (ulong)(psVar5->session).sessionId.identifier.guid.data4[6],
                (ulong)(psVar5->session).sessionId.identifier.guid.data4[7]);
  }
  else {
    pUVar6 = &psVar5->session;
  }
  return pUVar6;
}

Assistant:

UA_Session *
UA_SessionManager_getSession(UA_SessionManager *sm, const UA_NodeId *token) {
    session_list_entry *current = NULL;
    LIST_FOREACH(current, &sm->sessions, pointers) {
        /* Token does not match */
        if(!UA_NodeId_equal(&current->session.authenticationToken, token))
            continue;

        /* Session has timed out */
        if(UA_DateTime_nowMonotonic() > current->session.validTill) {
            UA_LOG_INFO_SESSION(sm->server->config.logger, &current->session,
                                "Client tries to use a session that has timed out");
            return NULL;
        }

        /* Ok, return */
        return &current->session;
    }

    /* Session not found */
    UA_LOG_INFO(sm->server->config.logger, UA_LOGCATEGORY_SESSION,
                "Try to use Session with token " UA_PRINTF_GUID_FORMAT " but is not found",
                UA_PRINTF_GUID_DATA(token->identifier.guid));
    return NULL;
}